

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_internal.h
# Opt level: O0

ImGuiTableSettings * __thiscall
ImChunkStream<ImGuiTableSettings>::next_chunk
          (ImChunkStream<ImGuiTableSettings> *this,ImGuiTableSettings *p)

{
  int iVar1;
  ImGuiTableSettings *pIVar2;
  ImGuiTableSettings *in_RSI;
  ImChunkStream<ImGuiTableSettings> *in_RDI;
  bool bVar3;
  size_t HDR_SZ;
  ImGuiTableSettings *local_8;
  
  pIVar2 = begin(in_RDI);
  bVar3 = false;
  if (pIVar2 <= in_RSI) {
    pIVar2 = end(in_RDI);
    bVar3 = in_RSI < pIVar2;
  }
  if (bVar3) {
    iVar1 = chunk_size(in_RDI,in_RSI);
    local_8 = (ImGuiTableSettings *)((long)&in_RSI->ID + (long)iVar1);
    pIVar2 = end(in_RDI);
    if (local_8 == (ImGuiTableSettings *)&pIVar2->SaveFlags) {
      local_8 = (ImGuiTableSettings *)0x0;
    }
    else {
      pIVar2 = end(in_RDI);
      if (pIVar2 <= local_8) {
        __assert_fail("p < end()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/aatifjiwani[P]lens-flare/src/imgui/imgui_internal.h"
                      ,0x25f,
                      "T *ImChunkStream<ImGuiTableSettings>::next_chunk(T *) [T = ImGuiTableSettings]"
                     );
      }
    }
    return local_8;
  }
  __assert_fail("p >= begin() && p < end()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/aatifjiwani[P]lens-flare/src/imgui/imgui_internal.h"
                ,0x25f,
                "T *ImChunkStream<ImGuiTableSettings>::next_chunk(T *) [T = ImGuiTableSettings]");
}

Assistant:

T*      next_chunk(T* p)            { size_t HDR_SZ = 4; IM_ASSERT(p >= begin() && p < end()); p = (T*)(void*)((char*)(void*)p + chunk_size(p)); if (p == (T*)(void*)((char*)end() + HDR_SZ)) return (T*)0; IM_ASSERT(p < end()); return p; }